

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  size_t sVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (this->state_ == kLastState) {
    this->state_ = kEndState;
  }
  else {
    sVar1 = (this->splitter_->text_)._M_len;
    pcVar2 = (this->splitter_->text_)._M_str;
    local_30._M_len = sVar1;
    local_30._M_str = pcVar2;
    auVar3 = absl::lts_20240722::ByString::Find(&this->delimiter_,sVar1,pcVar2,this->pos_);
    if (auVar3._8_8_ == pcVar2 + sVar1) {
      this->state_ = kLastState;
    }
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,this->pos_,(long)auVar3._8_8_ - (long)(pcVar2 + this->pos_));
    (this->curr_)._M_len = bVar4._M_len;
    (this->curr_)._M_str = bVar4._M_str;
    this->pos_ = this->pos_ + auVar3._0_8_ + bVar4._M_len;
  }
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }